

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_encoder.c
# Opt level: O3

int pt_encode_ip(pt_encoder *encoder,pt_opcode op,pt_packet_ip *packet)

{
  pt_ip_compression pVar1;
  bool bVar2;
  pt_ip_compression pVar3;
  ulong uVar4;
  pt_ip_compression pVar5;
  byte *pbVar6;
  pt_ip_compression pVar7;
  
  if (packet == (pt_packet_ip *)0x0) {
    return 1;
  }
  pVar1 = packet->ipc;
  pVar3 = ~pt_ipc_update_16;
  switch(pVar1) {
  case pt_ipc_suppressed:
    bVar2 = true;
    pVar5 = pVar1;
    goto LAB_00108e14;
  case pt_ipc_update_16:
    pVar5 = pt_ipc_update_32;
    break;
  case pt_ipc_update_32:
    pVar5 = pt_ipc_update_48;
    break;
  case pt_ipc_sext_48:
  case pt_ipc_update_48:
    pVar5 = pt_ipc_full;
    break;
  default:
    goto switchD_00108de5_caseD_5;
  case pt_ipc_full:
    pVar5 = 8;
  }
  bVar2 = false;
LAB_00108e14:
  pbVar6 = encoder->pos;
  if (pbVar6 == (byte *)0x0) {
    pVar3 = ~pt_ipc_suppressed;
  }
  else {
    pVar7 = pVar5 | pt_ipc_update_16;
    pVar3 = ~pt_ipc_full;
    if (((encoder->config).begin <= pbVar6 + pVar7) && (pbVar6 + pVar7 <= (encoder->config).end)) {
      *pbVar6 = (byte)(pVar1 << 5) | (byte)op;
      pbVar6 = pbVar6 + 1;
      if (!bVar2) {
        uVar4 = packet->ip;
        do {
          *pbVar6 = (byte)uVar4;
          pbVar6 = pbVar6 + 1;
          uVar4 = uVar4 >> 8;
          pVar5 = pVar5 - pt_ipc_update_16;
        } while (pVar5 != pt_ipc_suppressed);
      }
      encoder->pos = pbVar6;
      pVar3 = pVar7;
    }
  }
switchD_00108de5_caseD_5:
  return pVar3;
}

Assistant:

static int pt_encode_ip(struct pt_encoder *encoder, enum pt_opcode op,
			const struct pt_packet_ip *packet)
{
	uint8_t *pos;
	uint8_t opc, ipc;
	int size, errcode;

	if (!encoder || !packet)
		return pte_internal;

	size = pt_ipc_size(packet->ipc);
	if (size < 0)
		return size;

	errcode = pt_reserve(encoder,
			     /* opc size = */ 1u + (unsigned int) size);
	if (errcode < 0)
		return errcode;

	/* We already checked the ipc in pt_ipc_size(). */
	ipc = (uint8_t) (packet->ipc << pt_opm_ipc_shr);
	opc = (uint8_t) op;

	pos = encoder->pos;
	*pos++ = opc | ipc;

	encoder->pos = pt_encode_int(pos, packet->ip, size);
	return /* opc size = */ 1 + size;
}